

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_util.c
# Opt level: O0

int get_tempdir(archive_string *temppath)

{
  char *__s;
  size_t sVar1;
  archive_string *in_RDI;
  archive_string *unaff_retaddr;
  char *tmp;
  char c;
  archive_string *paVar2;
  
  __s = getenv("TMPDIR");
  if (__s == (char *)0x0) {
    __s = "/tmp";
  }
  in_RDI->length = 0;
  paVar2 = in_RDI;
  if (__s == (char *)0x0) {
    c = '\0';
  }
  else {
    sVar1 = strlen(__s);
    c = (char)(sVar1 >> 0x38);
  }
  archive_strncat(unaff_retaddr,paVar2,(size_t)__s);
  if (paVar2->s[paVar2->length - 1] != '/') {
    archive_strappend_char(in_RDI,c);
  }
  return 0;
}

Assistant:

static int
get_tempdir(struct archive_string *temppath)
{
	const char *tmp;

	tmp = getenv("TMPDIR");
	if (tmp == NULL)
#ifdef _PATH_TMP
		tmp = _PATH_TMP;
#else
                tmp = "/tmp";
#endif
	archive_strcpy(temppath, tmp);
	if (temppath->s[temppath->length-1] != '/')
		archive_strappend_char(temppath, '/');
	return (ARCHIVE_OK);
}